

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O1

Integer pnga_sprs_array_sprsdns_multiply(Integer s_a,Integer g_b,Integer trans)

{
  long lVar1;
  C_Integer *pCVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  _sparse_array *p_Var11;
  Integer IVar12;
  Integer IVar13;
  Integer g_a;
  Integer *mapc;
  void *pvVar14;
  logical lVar15;
  Integer IVar16;
  long lVar17;
  Integer IVar18;
  int *piVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long *plVar24;
  long lVar25;
  long lVar26;
  undefined8 *puVar27;
  undefined1 (*pauVar28) [16];
  uint uVar29;
  int *piVar30;
  long lVar31;
  long *plVar32;
  float *pfVar33;
  double *pdVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  float *pfVar38;
  double *pdVar39;
  long lVar40;
  float fVar41;
  float fVar42;
  long lVar43;
  float fVar48;
  float fVar49;
  long lVar50;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  void *data_c;
  Integer thi_b [2];
  Integer tlo_b [2];
  Integer ld_c [2];
  Integer thi_c [2];
  Integer tlo_c [2];
  Integer hi_c [2];
  Integer lo_c [2];
  void *val_a;
  Integer jhi_a;
  Integer jlo_a;
  void *jptr_a;
  void *iptr_a;
  Integer gdims [2];
  undefined1 (*local_1e0) [16];
  long local_1b0;
  undefined1 (*local_180) [16];
  long local_178;
  long lStack_170;
  long local_168;
  long lStack_160;
  long local_158;
  long local_150;
  Integer local_148;
  Integer local_140;
  Integer local_138;
  Integer local_130;
  long local_128;
  undefined1 (*local_120) [16];
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  Integer local_d8;
  long local_d0;
  Integer local_c8;
  Integer local_c0;
  Integer local_b8;
  long local_b0;
  Integer local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long local_58;
  Integer local_50;
  Integer local_48;
  Integer local_40;
  
  lVar1 = s_a + 1000;
  lVar40 = g_b + 1000;
  lVar25 = lVar1 * 200;
  local_c8 = s_a;
  local_a8 = g_b;
  IVar12 = pnga_pgroup_nnodes(SPA[lVar1].grp);
  IVar13 = pnga_pgroup_nodeid(SPA[lVar1].grp);
  lVar26 = (long)_ga_sync_begin;
  lVar17 = (long)_ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (lVar26 != 0) {
    pnga_pgroup_sync(SPA[lVar1].grp);
  }
  if (SPA[lVar1].type != (long)GA[lVar40].type) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) types of sparse matrices A and B must match",0);
  }
  local_138 = SPA[lVar1].type;
  if (SPA[lVar1].grp != (long)GA[lVar40].p_handle) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) matrices A and B must be on the same group",0);
  }
  if ((long)GA[lVar40].ndim != 2) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) matrix B must be of dimension 2",
               (long)GA[lVar40].ndim);
  }
  if (trans == 0) {
    lVar43 = GA[lVar40].dims[0];
  }
  else {
    lVar43 = GA[lVar40].dims[1];
  }
  local_128 = lVar17;
  if (SPA[lVar1].jdim != lVar43) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) column dimension of A must match row dimension of B"
               ,0);
  }
  pCVar2 = GA->dims + 1;
  if (trans != 0) {
    pCVar2 = GA->dims;
  }
  local_d8 = pCVar2[lVar40 * 0x6d];
  IVar18 = SPA[lVar1].idim;
  IVar16 = local_d8;
  if (trans == 0) {
    IVar18 = local_d8;
    IVar16 = SPA[lVar1].idim;
  }
  pnga_mask_sync(lVar26,local_128);
  g_a = pnga_create_handle();
  local_48 = IVar16;
  local_40 = IVar18;
  pnga_set_data(g_a,2,&local_48,local_138);
  mapc = (Integer *)malloc(IVar12 * 8 + 8);
  pvVar14 = malloc(IVar12 * 8);
  local_130 = IVar12;
  if (0 < IVar12) {
    memset(pvVar14,0,IVar12 * 8);
  }
  IVar12 = local_130;
  p_Var11 = SPA;
  *(Integer *)((long)pvVar14 + IVar13 * 8) = (SPA[lVar1].ihi - SPA[lVar1].ilo) + 1;
  pnga_pgroup_gop(p_Var11[lVar1].grp,0x3ea,pvVar14,local_130,"+");
  *mapc = 1;
  if (trans == 0) {
    if (1 < IVar12) {
      IVar12 = *mapc;
      lVar17 = 0;
      do {
        IVar12 = IVar12 + *(long *)((long)pvVar14 + lVar17 * 8);
        mapc[lVar17 + 1] = IVar12;
        lVar17 = lVar17 + 1;
      } while (local_130 + -1 != lVar17);
    }
    mapc[local_130] = 1;
    IVar12 = 1;
    local_58 = local_130;
    IVar13 = local_130;
  }
  else {
    mapc[1] = 1;
    local_58 = 1;
    IVar13 = IVar12;
    if (1 < IVar12) {
      IVar16 = mapc[1];
      lVar17 = 1;
      do {
        IVar16 = IVar16 + *(long *)((long)pvVar14 + lVar17 * 8 + -8);
        mapc[lVar17 + 1] = IVar16;
        lVar17 = lVar17 + 1;
      } while (IVar12 != lVar17);
    }
  }
  local_50 = IVar12;
  pnga_set_irreg_distr(g_a,mapc,&local_58);
  pnga_set_pgroup(g_a,SPA[lVar1].grp);
  lVar1 = local_128;
  pnga_mask_sync(lVar26,local_128);
  lVar15 = pnga_allocate(g_a);
  if (lVar15 == 0) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) could not allocate product array C",0);
  }
  pnga_mask_sync(lVar26,lVar1);
  pnga_zero(g_a);
  if (0 < IVar13) {
    IVar12 = 0;
    local_138 = local_138 + -0x3e9;
    local_b8 = g_a;
    local_b0 = lVar25;
    do {
      local_e8 = *(long *)((long)&SPA->ilo + lVar25) + 1;
      local_f8 = *(long *)((long)&SPA->ihi + lVar25) + 1;
      pnga_sprs_array_column_distribution(local_c8,IVar12,&local_e0,&local_f0);
      lVar17 = local_e8;
      lVar1 = local_f8;
      local_e0 = local_e0 + 1;
      local_f0 = local_f0 + 1;
      if (trans == 0) {
        local_108 = local_e8;
        local_118 = local_f8;
        local_110 = local_f0;
        local_100 = local_e0;
      }
      else {
        local_100 = local_e8;
        local_110 = local_f8;
        local_118 = local_f0;
        local_108 = local_e0;
      }
      local_d0 = local_f0;
      local_c0 = IVar12;
      if (0 < *(long *)((long)&SPA->nblocks + lVar25)) {
        lVar26 = local_e8 + -1;
        lVar40 = 0;
        local_a0 = local_e0;
        do {
          lVar43 = local_a0;
          IVar12 = *(Integer *)(*(long *)((long)&SPA->blkidx + lVar25) + lVar40 * 8);
          if (trans == 0) {
            local_148 = (local_118 - local_108) + 1;
            local_140 = local_d8;
          }
          else {
            local_148 = local_d8;
            local_140 = (local_110 - local_100) + 1;
          }
          local_98 = lVar40;
          pnga_access_ptr(g_a,&local_108,&local_118,&local_180,&local_148);
          IVar13 = local_c8;
          pnga_sprs_array_column_distribution(local_c8,IVar12,&local_80,&local_88);
          pnga_sprs_array_access_col_block(IVar13,IVar12,&local_70,&local_78,&local_90);
          lVar40 = local_80;
          lStack_170 = local_d0;
          local_178 = local_88 + 1;
          local_168 = local_80 + 1;
          lStack_160 = lVar43;
          if (trans != 0) {
            local_178 = local_d0;
            lStack_170 = local_88 + 1;
            local_168 = lVar43;
            lStack_160 = local_80 + 1;
          }
          lVar43 = (local_178 - local_168) + 1;
          lVar50 = (lStack_170 - lStack_160) + 1;
          pvVar14 = malloc(lVar50 * lVar43 * *(long *)((long)&SPA->size + lVar25));
          local_68 = lVar43;
          lStack_60 = lVar50;
          pnga_get(local_a8,&local_168,&local_178,pvVar14,&local_68);
          if (*(long *)((long)&SPA->idx_size + lVar25) == 4) {
            switch(local_138) {
            case 0:
              if (lVar17 <= lVar1) {
                lVar43 = (local_178 - local_168) + 1;
                local_150 = 0;
                lVar25 = lVar26;
                do {
                  lVar50 = lVar25 - lVar26;
                  iVar6 = *(int *)(local_70 + 4 + lVar50 * 4);
                  iVar7 = *(int *)(local_70 + lVar50 * 4);
                  uVar29 = iVar6 - iVar7;
                  if (uVar29 != 0 && iVar7 <= iVar6) {
                    uVar37 = 0;
                    do {
                      lVar31 = *(int *)(local_78 + uVar37 * 4 +
                                       (long)*(int *)(local_70 + lVar50 * 4) * 4) - lVar40;
                      if (trans == 0) {
                        if (local_168 <= local_178) {
                          piVar30 = (int *)((long)pvVar14 + lVar31 * 4);
                          lVar31 = lVar43;
                          piVar19 = (int *)(*local_180 + local_150);
                          do {
                            *piVar19 = *piVar19 +
                                       *piVar30 *
                                       *(int *)(local_90 + uVar37 * 4 +
                                               (long)*(int *)(local_70 + lVar50 * 4) * 4);
                            piVar19 = piVar19 + local_148;
                            piVar30 = piVar30 + lVar43;
                            lVar31 = lVar31 + -1;
                          } while (lVar31 != 0);
                        }
                      }
                      else if (local_168 <= local_178) {
                        lVar22 = 0;
                        do {
                          *(int *)(*local_180 + lVar22 * 4 + local_148 * local_150) =
                               *(int *)(*local_180 + lVar22 * 4 + local_148 * local_150) +
                               *(int *)((long)pvVar14 + lVar22 * 4 + lVar31 * lVar43 * 4) *
                               *(int *)(local_90 + uVar37 * 4 +
                                       (long)*(int *)(local_70 + lVar50 * 4) * 4);
                          lVar22 = lVar22 + 1;
                        } while (lVar43 != lVar22);
                      }
                      uVar37 = uVar37 + 1;
                    } while (uVar37 != uVar29);
                  }
                  lVar25 = lVar25 + 1;
                  local_150 = local_150 + 4;
                } while (lVar25 != lVar1);
              }
              break;
            case 1:
              if (lVar17 <= lVar1) {
                lVar43 = (local_178 - local_168) + 1;
                lVar50 = 0;
                lVar25 = lVar26;
                do {
                  lVar31 = lVar25 - lVar26;
                  iVar6 = *(int *)(local_70 + 4 + lVar31 * 4);
                  iVar7 = *(int *)(local_70 + lVar31 * 4);
                  uVar29 = iVar6 - iVar7;
                  if (uVar29 != 0 && iVar7 <= iVar6) {
                    lVar22 = local_90 + (long)iVar7 * 8;
                    uVar37 = 0;
                    do {
                      lVar20 = *(int *)(local_78 + (long)iVar7 * 4 + uVar37 * 4) - lVar40;
                      if (trans == 0) {
                        if (local_168 <= local_178) {
                          lVar35 = local_168;
                          do {
                            plVar32 = (long *)((long)local_180 +
                                              (lVar35 - local_168) * local_148 * 8 + lVar31 * 8);
                            *plVar32 = *plVar32 +
                                       *(long *)((long)pvVar14 +
                                                (lVar35 - local_168) * lVar43 * 8 + lVar20 * 8) *
                                       *(long *)(lVar22 + uVar37 * 8);
                            bVar8 = lVar35 < local_178;
                            lVar35 = lVar35 + 1;
                          } while (bVar8);
                        }
                      }
                      else if (local_168 <= local_178) {
                        lVar35 = local_168 + -1;
                        do {
                          plVar32 = (long *)((long)local_180 +
                                            lVar35 * 8 + local_148 * lVar50 + local_168 * -8 + 8);
                          *plVar32 = *plVar32 +
                                     *(long *)((long)pvVar14 +
                                              lVar35 * 8 + local_168 * -8 + lVar20 * lVar43 * 8 + 8)
                                     * *(long *)(lVar22 + uVar37 * 8);
                          lVar35 = lVar35 + 1;
                        } while (lVar35 < local_178);
                      }
                      uVar37 = uVar37 + 1;
                    } while (uVar37 != uVar29);
                  }
                  lVar25 = lVar25 + 1;
                  lVar50 = lVar50 + 8;
                } while (lVar25 != lVar1);
              }
              break;
            case 2:
              if (lVar17 <= lVar1) {
                lVar43 = (local_178 - local_168) + 1;
                local_1e0 = (undefined1 (*) [16])0x0;
                lVar25 = lVar26;
                do {
                  iVar6 = *(int *)(local_70 + 4 + (lVar25 - lVar26) * 4);
                  iVar7 = *(int *)(local_70 + (lVar25 - lVar26) * 4);
                  uVar29 = iVar6 - iVar7;
                  if (uVar29 != 0 && iVar7 <= iVar6) {
                    lVar50 = local_90 + (long)iVar7 * 4;
                    uVar37 = 0;
                    do {
                      lVar31 = *(int *)(local_78 + (long)iVar7 * 4 + uVar37 * 4) - lVar40;
                      if (trans == 0) {
                        if (local_168 <= local_178) {
                          pfVar33 = (float *)((long)pvVar14 + lVar31 * 4);
                          lVar31 = lVar43;
                          pfVar38 = (float *)(*local_180 + (long)local_1e0);
                          do {
                            *pfVar38 = *(float *)(lVar50 + uVar37 * 4) * *pfVar33 + *pfVar38;
                            pfVar38 = pfVar38 + local_148;
                            pfVar33 = pfVar33 + lVar43;
                            lVar31 = lVar31 + -1;
                          } while (lVar31 != 0);
                        }
                      }
                      else if (local_168 <= local_178) {
                        lVar22 = 0;
                        do {
                          *(float *)(*local_180 + lVar22 * 4 + local_148 * (long)local_1e0) =
                               *(float *)(lVar50 + uVar37 * 4) *
                               *(float *)((long)pvVar14 + lVar22 * 4 + lVar31 * lVar43 * 4) +
                               *(float *)(*local_180 + lVar22 * 4 + local_148 * (long)local_1e0);
                          lVar22 = lVar22 + 1;
                        } while (lVar43 != lVar22);
                      }
                      uVar37 = uVar37 + 1;
                    } while (uVar37 != uVar29);
                  }
                  lVar25 = lVar25 + 1;
                  local_1e0 = (undefined1 (*) [16])((long)local_1e0 + 4);
                } while (lVar25 != lVar1);
              }
              break;
            case 3:
              if (lVar17 <= lVar1) {
                lVar43 = (local_178 - local_168) + 1;
                local_1e0 = (undefined1 (*) [16])0x0;
                lVar25 = lVar26;
                do {
                  iVar6 = *(int *)(local_70 + 4 + (lVar25 - lVar26) * 4);
                  iVar7 = *(int *)(local_70 + (lVar25 - lVar26) * 4);
                  uVar29 = iVar6 - iVar7;
                  if (uVar29 != 0 && iVar7 <= iVar6) {
                    lVar50 = local_90 + (long)iVar7 * 8;
                    uVar37 = 0;
                    do {
                      lVar31 = *(int *)(local_78 + (long)iVar7 * 4 + uVar37 * 4) - lVar40;
                      if (trans == 0) {
                        if (local_168 <= local_178) {
                          pdVar34 = (double *)((long)pvVar14 + lVar31 * 8);
                          lVar31 = lVar43;
                          pdVar39 = (double *)(*local_180 + (long)local_1e0);
                          do {
                            *pdVar39 = *(double *)(lVar50 + uVar37 * 8) * *pdVar34 + *pdVar39;
                            pdVar39 = pdVar39 + local_148;
                            pdVar34 = pdVar34 + lVar43;
                            lVar31 = lVar31 + -1;
                          } while (lVar31 != 0);
                        }
                      }
                      else if (local_168 <= local_178) {
                        lVar22 = 0;
                        do {
                          *(double *)(*local_180 + lVar22 * 8 + local_148 * (long)local_1e0) =
                               *(double *)(lVar50 + uVar37 * 8) *
                               *(double *)((long)pvVar14 + lVar22 * 8 + lVar31 * lVar43 * 8) +
                               *(double *)(*local_180 + lVar22 * 8 + local_148 * (long)local_1e0);
                          lVar22 = lVar22 + 1;
                        } while (lVar43 != lVar22);
                      }
                      uVar37 = uVar37 + 1;
                    } while (uVar37 != uVar29);
                  }
                  lVar25 = lVar25 + 1;
                  local_1e0 = (undefined1 (*) [16])((long)local_1e0 + 8);
                } while (lVar25 != lVar1);
              }
              break;
            case 5:
              if (lVar17 <= lVar1) {
                lVar43 = (local_178 - local_168) + 1;
                local_158 = 0;
                lVar25 = lVar26;
                do {
                  local_150 = lVar25;
                  iVar6 = *(int *)(local_70 + 4 + (local_150 - lVar26) * 4);
                  iVar7 = *(int *)(local_70 + (local_150 - lVar26) * 4);
                  lVar25 = (long)iVar7;
                  uVar29 = iVar6 - iVar7;
                  if (uVar29 != 0 && iVar7 <= iVar6) {
                    uVar37 = 0;
                    do {
                      lVar50 = (long)*(int *)(local_78 + lVar25 * 4 + uVar37 * 4);
                      if (trans == 0) {
                        if (local_168 <= local_178) {
                          pfVar33 = (float *)((long)pvVar14 + lVar50 * 8 + lVar40 * -8 + 4);
                          puVar27 = (undefined8 *)(*local_180 + local_158);
                          lVar50 = lVar43;
                          do {
                            uVar5 = *(undefined8 *)(local_90 + (lVar25 + uVar37) * 8);
                            fVar42 = (float)uVar5;
                            fVar49 = (float)((ulong)uVar5 >> 0x20);
                            *puVar27 = CONCAT44((float)((ulong)*puVar27 >> 0x20) +
                                                pfVar33[-1] * fVar49 + fVar42 * *pfVar33,
                                                (float)*puVar27 +
                                                pfVar33[-1] * fVar42 + -fVar49 * *pfVar33);
                            puVar27 = puVar27 + local_148;
                            pfVar33 = pfVar33 + lVar43 * 2;
                            lVar50 = lVar50 + -1;
                          } while (lVar50 != 0);
                        }
                      }
                      else if (local_168 <= local_178) {
                        lVar31 = (lVar50 - lVar40) * lVar43 * 8;
                        lVar50 = 0;
                        do {
                          uVar5 = *(undefined8 *)(local_90 + (lVar25 + uVar37) * 8);
                          fVar41 = (float)uVar5;
                          fVar48 = (float)((ulong)uVar5 >> 0x20);
                          fVar42 = *(float *)((long)pvVar14 + lVar50 * 8 + lVar31);
                          fVar49 = *(float *)((long)pvVar14 + lVar50 * 8 + lVar31 + 4);
                          *(ulong *)(*local_180 + lVar50 * 8 + local_148 * local_158) =
                               CONCAT44((float)((ulong)*(undefined8 *)
                                                        (*local_180 +
                                                        lVar50 * 8 + local_148 * local_158) >> 0x20)
                                        + fVar42 * fVar48 + fVar41 * fVar49,
                                        (float)*(undefined8 *)
                                                (*local_180 + lVar50 * 8 + local_148 * local_158) +
                                        fVar42 * fVar41 + -fVar48 * fVar49);
                          lVar50 = lVar50 + 1;
                        } while (lVar43 != lVar50);
                      }
                      uVar37 = uVar37 + 1;
                    } while (uVar37 != uVar29);
                  }
                  local_158 = local_158 + 8;
                  lVar25 = local_150 + 1;
                } while (local_150 + 1 != lVar1);
              }
              break;
            case 6:
              if (lVar17 <= lVar1) {
                lVar43 = (local_178 - local_168) + 1;
                local_120 = local_180;
                local_1e0 = local_180;
                local_158 = 0;
                lVar25 = lVar26;
                do {
                  local_150 = lVar25;
                  iVar6 = *(int *)(local_70 + 4 + (local_150 - lVar26) * 4);
                  iVar7 = *(int *)(local_70 + (local_150 - lVar26) * 4);
                  lVar25 = (long)iVar7;
                  uVar29 = iVar6 - iVar7;
                  if (uVar29 != 0 && iVar7 <= iVar6) {
                    uVar37 = 0;
                    do {
                      lVar50 = (long)*(int *)(local_78 + lVar25 * 4 + uVar37 * 4);
                      if (trans == 0) {
                        if (local_168 <= local_178) {
                          pdVar34 = (double *)((long)pvVar14 + lVar50 * 0x10 + lVar40 * -0x10 + 8);
                          lVar50 = lVar43;
                          pauVar28 = local_1e0;
                          do {
                            pdVar39 = (double *)(local_90 + (uVar37 + lVar25) * 0x10);
                            dVar3 = *pdVar39;
                            dVar4 = pdVar39[1];
                            auVar45._0_8_ =
                                 *(double *)*pauVar28 + pdVar34[-1] * dVar3 + -dVar4 * *pdVar34;
                            auVar45._8_8_ =
                                 *(double *)(*pauVar28 + 8) + pdVar34[-1] * dVar4 + dVar3 * *pdVar34
                            ;
                            *pauVar28 = auVar45;
                            pauVar28 = pauVar28 + local_148;
                            pdVar34 = pdVar34 + lVar43 * 2;
                            lVar50 = lVar50 + -1;
                          } while (lVar50 != 0);
                        }
                      }
                      else if (local_168 <= local_178) {
                        lVar22 = (lVar50 - lVar40) * lVar43 * 0x10;
                        lVar31 = 0;
                        lVar50 = lVar43;
                        do {
                          pdVar34 = (double *)(local_90 + (uVar37 + lVar25) * 0x10);
                          dVar9 = *pdVar34;
                          dVar10 = pdVar34[1];
                          dVar3 = *(double *)((long)pvVar14 + lVar31 + lVar22);
                          dVar4 = *(double *)((long)pvVar14 + lVar31 + lVar22 + 8);
                          auVar44._0_8_ =
                               *(double *)(*local_180 + lVar31 + local_148 * local_158) +
                               dVar3 * dVar9 + -dVar10 * dVar4;
                          auVar44._8_8_ =
                               *(double *)((long)(*local_180 + lVar31 + local_148 * local_158) + 8)
                               + dVar3 * dVar10 + dVar9 * dVar4;
                          *(undefined1 (*) [16])(*local_180 + lVar31 + local_148 * local_158) =
                               auVar44;
                          lVar31 = lVar31 + 0x10;
                          lVar50 = lVar50 + -1;
                        } while (lVar50 != 0);
                      }
                      uVar37 = uVar37 + 1;
                    } while (uVar37 != uVar29);
                  }
                  local_158 = local_158 + 0x10;
                  local_1e0 = local_1e0 + 1;
                  lVar25 = local_150 + 1;
                } while (local_150 + 1 != lVar1);
              }
              break;
            case 0xf:
              if (lVar17 <= lVar1) {
                lVar43 = (local_178 - local_168) + 1;
                local_1b0 = 0;
                lVar25 = lVar26;
                do {
                  iVar6 = *(int *)(local_70 + 4 + (lVar25 - lVar26) * 4);
                  iVar7 = *(int *)(local_70 + (lVar25 - lVar26) * 4);
                  uVar29 = iVar6 - iVar7;
                  if (uVar29 != 0 && iVar7 <= iVar6) {
                    lVar50 = local_90 + (long)iVar7 * 8;
                    uVar37 = 0;
                    do {
                      lVar31 = *(int *)(local_78 + (long)iVar7 * 4 + uVar37 * 4) - lVar40;
                      if (trans == 0) {
                        if (local_168 <= local_178) {
                          plVar32 = (long *)((long)pvVar14 + lVar31 * 8);
                          plVar24 = (long *)(*local_180 + local_1b0);
                          lVar31 = lVar43;
                          do {
                            *plVar24 = *plVar24 + *plVar32 * *(long *)(lVar50 + uVar37 * 8);
                            plVar24 = plVar24 + local_148;
                            plVar32 = plVar32 + lVar43;
                            lVar31 = lVar31 + -1;
                          } while (lVar31 != 0);
                        }
                      }
                      else if (local_168 <= local_178) {
                        lVar22 = 0;
                        do {
                          *(long *)(*local_180 + lVar22 * 8 + local_148 * local_1b0) =
                               *(long *)(*local_180 + lVar22 * 8 + local_148 * local_1b0) +
                               *(long *)((long)pvVar14 + lVar22 * 8 + lVar31 * lVar43 * 8) *
                               *(long *)(lVar50 + uVar37 * 8);
                          lVar22 = lVar22 + 1;
                        } while (lVar43 != lVar22);
                      }
                      uVar37 = uVar37 + 1;
                    } while (uVar37 != uVar29);
                  }
                  lVar25 = lVar25 + 1;
                  local_1b0 = local_1b0 + 8;
                } while (lVar25 != lVar1);
              }
            }
          }
          else {
            switch(local_138) {
            case 0:
              if (lVar17 <= lVar1) {
                lVar43 = (local_178 - local_168) + 1;
                local_1b0 = 0;
                lVar25 = lVar26;
                do {
                  lVar50 = *(long *)(local_70 + (lVar25 - lVar26) * 8);
                  lVar31 = *(long *)(local_70 + 8 + (lVar25 - lVar26) * 8);
                  if (lVar50 < lVar31) {
                    lVar22 = local_90 + lVar50 * 4;
                    lVar20 = 0;
                    do {
                      lVar35 = *(long *)(local_78 + lVar50 * 8 + lVar20 * 8) - lVar40;
                      if (trans == 0) {
                        if (local_168 <= local_178) {
                          piVar30 = (int *)((long)pvVar14 + lVar35 * 4);
                          piVar19 = (int *)(*local_180 + local_1b0);
                          lVar35 = lVar43;
                          do {
                            *piVar19 = *piVar19 + *piVar30 * *(int *)(lVar22 + lVar20 * 4);
                            piVar19 = piVar19 + local_148;
                            piVar30 = piVar30 + lVar43;
                            lVar35 = lVar35 + -1;
                          } while (lVar35 != 0);
                        }
                      }
                      else if (local_168 <= local_178) {
                        lVar23 = 0;
                        do {
                          *(int *)(*local_180 + lVar23 * 4 + local_148 * local_1b0) =
                               *(int *)(*local_180 + lVar23 * 4 + local_148 * local_1b0) +
                               *(int *)((long)pvVar14 + lVar23 * 4 + lVar35 * lVar43 * 4) *
                               *(int *)(lVar22 + lVar20 * 4);
                          lVar23 = lVar23 + 1;
                        } while (lVar43 != lVar23);
                      }
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != lVar31 - lVar50);
                  }
                  lVar25 = lVar25 + 1;
                  local_1b0 = local_1b0 + 4;
                } while (lVar25 != lVar1);
              }
              break;
            case 1:
              if (lVar17 <= lVar1) {
                lVar43 = (local_178 - local_168) + 1;
                lVar50 = 0;
                lVar25 = lVar26;
                do {
                  lVar20 = lVar25 - lVar26;
                  lVar31 = *(long *)(local_70 + 8 + lVar20 * 8);
                  lVar22 = *(long *)(local_70 + lVar20 * 8);
                  if (lVar22 < lVar31) {
                    lVar35 = 0;
                    do {
                      lVar21 = *(long *)(local_78 + *(long *)(local_70 + lVar20 * 8) * 8 +
                                        lVar35 * 8) - lVar40;
                      lVar23 = local_90 + lVar35 * 8;
                      if (trans == 0) {
                        if (local_168 <= local_178) {
                          lVar36 = local_168;
                          do {
                            plVar32 = (long *)((long)local_180 +
                                              (lVar36 - local_168) * local_148 * 8 + lVar20 * 8);
                            *plVar32 = *plVar32 +
                                       *(long *)((long)pvVar14 +
                                                (lVar36 - local_168) * lVar43 * 8 + lVar21 * 8) *
                                       *(long *)(lVar23 + *(long *)(local_70 + lVar20 * 8) * 8);
                            bVar8 = lVar36 < local_178;
                            lVar36 = lVar36 + 1;
                          } while (bVar8);
                        }
                      }
                      else if (local_168 <= local_178) {
                        lVar36 = local_168 + -1;
                        do {
                          plVar32 = (long *)((long)local_180 +
                                            lVar36 * 8 + local_148 * lVar50 + local_168 * -8 + 8);
                          *plVar32 = *plVar32 +
                                     *(long *)((long)pvVar14 +
                                              lVar36 * 8 + local_168 * -8 + lVar21 * lVar43 * 8 + 8)
                                     * *(long *)(lVar23 + *(long *)(local_70 + lVar20 * 8) * 8);
                          lVar36 = lVar36 + 1;
                        } while (lVar36 < local_178);
                      }
                      lVar35 = lVar35 + 1;
                    } while (lVar35 != lVar31 - lVar22);
                  }
                  lVar25 = lVar25 + 1;
                  lVar50 = lVar50 + 8;
                } while (lVar25 != lVar1);
              }
              break;
            case 2:
              if (lVar17 <= lVar1) {
                lVar43 = (local_178 - local_168) + 1;
                local_1e0 = (undefined1 (*) [16])0x0;
                lVar25 = lVar26;
                do {
                  lVar50 = *(long *)(local_70 + (lVar25 - lVar26) * 8);
                  lVar31 = *(long *)(local_70 + 8 + (lVar25 - lVar26) * 8);
                  if (lVar50 < lVar31) {
                    lVar22 = local_90 + lVar50 * 4;
                    lVar20 = 0;
                    do {
                      lVar35 = *(long *)(local_78 + lVar50 * 8 + lVar20 * 8) - lVar40;
                      if (trans == 0) {
                        if (local_168 <= local_178) {
                          pfVar33 = (float *)((long)pvVar14 + lVar35 * 4);
                          lVar35 = lVar43;
                          pfVar38 = (float *)(*local_180 + (long)local_1e0);
                          do {
                            *pfVar38 = *(float *)(lVar22 + lVar20 * 4) * *pfVar33 + *pfVar38;
                            pfVar38 = pfVar38 + local_148;
                            pfVar33 = pfVar33 + lVar43;
                            lVar35 = lVar35 + -1;
                          } while (lVar35 != 0);
                        }
                      }
                      else if (local_168 <= local_178) {
                        lVar23 = 0;
                        do {
                          *(float *)(*local_180 + lVar23 * 4 + local_148 * (long)local_1e0) =
                               *(float *)(lVar22 + lVar20 * 4) *
                               *(float *)((long)pvVar14 + lVar23 * 4 + lVar35 * lVar43 * 4) +
                               *(float *)(*local_180 + lVar23 * 4 + local_148 * (long)local_1e0);
                          lVar23 = lVar23 + 1;
                        } while (lVar43 != lVar23);
                      }
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != lVar31 - lVar50);
                  }
                  lVar25 = lVar25 + 1;
                  local_1e0 = (undefined1 (*) [16])((long)local_1e0 + 4);
                } while (lVar25 != lVar1);
              }
              break;
            case 3:
              if (lVar17 <= lVar1) {
                lVar43 = (local_178 - local_168) + 1;
                local_1e0 = (undefined1 (*) [16])0x0;
                lVar25 = lVar26;
                do {
                  lVar50 = *(long *)(local_70 + (lVar25 - lVar26) * 8);
                  lVar31 = *(long *)(local_70 + 8 + (lVar25 - lVar26) * 8);
                  if (lVar50 < lVar31) {
                    lVar22 = local_90 + lVar50 * 8;
                    lVar20 = 0;
                    do {
                      lVar35 = *(long *)(local_78 + lVar50 * 8 + lVar20 * 8) - lVar40;
                      if (trans == 0) {
                        if (local_168 <= local_178) {
                          pdVar34 = (double *)((long)pvVar14 + lVar35 * 8);
                          lVar35 = lVar43;
                          pdVar39 = (double *)(*local_180 + (long)local_1e0);
                          do {
                            *pdVar39 = *(double *)(lVar22 + lVar20 * 8) * *pdVar34 + *pdVar39;
                            pdVar39 = pdVar39 + local_148;
                            pdVar34 = pdVar34 + lVar43;
                            lVar35 = lVar35 + -1;
                          } while (lVar35 != 0);
                        }
                      }
                      else if (local_168 <= local_178) {
                        lVar23 = 0;
                        do {
                          *(double *)(*local_180 + lVar23 * 8 + local_148 * (long)local_1e0) =
                               *(double *)(lVar22 + lVar20 * 8) *
                               *(double *)((long)pvVar14 + lVar23 * 8 + lVar35 * lVar43 * 8) +
                               *(double *)(*local_180 + lVar23 * 8 + local_148 * (long)local_1e0);
                          lVar23 = lVar23 + 1;
                        } while (lVar43 != lVar23);
                      }
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != lVar31 - lVar50);
                  }
                  lVar25 = lVar25 + 1;
                  local_1e0 = (undefined1 (*) [16])((long)local_1e0 + 8);
                } while (lVar25 != lVar1);
              }
              break;
            case 5:
              if (lVar17 <= lVar1) {
                lVar43 = (local_178 - local_168) + 1;
                local_158 = 0;
                lVar25 = lVar26;
                do {
                  local_150 = lVar25;
                  lVar25 = *(long *)(local_70 + (local_150 - lVar26) * 8);
                  lVar50 = *(long *)(local_70 + 8 + (local_150 - lVar26) * 8);
                  if (lVar25 < lVar50) {
                    lVar31 = 0;
                    do {
                      lVar22 = *(long *)(local_78 + lVar25 * 8 + lVar31 * 8);
                      if (trans == 0) {
                        if (local_168 <= local_178) {
                          pfVar33 = (float *)((long)pvVar14 + lVar22 * 8 + lVar40 * -8 + 4);
                          puVar27 = (undefined8 *)(*local_180 + local_158);
                          lVar22 = lVar43;
                          do {
                            uVar5 = *(undefined8 *)(local_90 + (lVar25 + lVar31) * 8);
                            fVar42 = (float)uVar5;
                            fVar49 = (float)((ulong)uVar5 >> 0x20);
                            *puVar27 = CONCAT44((float)((ulong)*puVar27 >> 0x20) +
                                                pfVar33[-1] * fVar49 + fVar42 * *pfVar33,
                                                (float)*puVar27 +
                                                pfVar33[-1] * fVar42 + -fVar49 * *pfVar33);
                            puVar27 = puVar27 + local_148;
                            pfVar33 = pfVar33 + lVar43 * 2;
                            lVar22 = lVar22 + -1;
                          } while (lVar22 != 0);
                        }
                      }
                      else if (local_168 <= local_178) {
                        lVar20 = (lVar22 - lVar40) * lVar43 * 8;
                        lVar22 = 0;
                        do {
                          uVar5 = *(undefined8 *)(local_90 + (lVar25 + lVar31) * 8);
                          fVar41 = (float)uVar5;
                          fVar48 = (float)((ulong)uVar5 >> 0x20);
                          fVar42 = *(float *)((long)pvVar14 + lVar22 * 8 + lVar20);
                          fVar49 = *(float *)((long)pvVar14 + lVar22 * 8 + lVar20 + 4);
                          *(ulong *)(*local_180 + lVar22 * 8 + local_148 * local_158) =
                               CONCAT44((float)((ulong)*(undefined8 *)
                                                        (*local_180 +
                                                        lVar22 * 8 + local_148 * local_158) >> 0x20)
                                        + fVar42 * fVar48 + fVar41 * fVar49,
                                        (float)*(undefined8 *)
                                                (*local_180 + lVar22 * 8 + local_148 * local_158) +
                                        fVar42 * fVar41 + -fVar48 * fVar49);
                          lVar22 = lVar22 + 1;
                        } while (lVar43 != lVar22);
                      }
                      lVar31 = lVar31 + 1;
                    } while (lVar31 != lVar50 - lVar25);
                  }
                  local_158 = local_158 + 8;
                  lVar25 = local_150 + 1;
                } while (local_150 + 1 != lVar1);
              }
              break;
            case 6:
              if (lVar17 <= lVar1) {
                lVar43 = (local_178 - local_168) + 1;
                local_120 = local_180;
                local_1e0 = local_180;
                local_158 = 0;
                lVar25 = lVar26;
                do {
                  local_150 = lVar25;
                  lVar25 = *(long *)(local_70 + (local_150 - lVar26) * 8);
                  lVar50 = *(long *)(local_70 + 8 + (local_150 - lVar26) * 8);
                  if (lVar25 < lVar50) {
                    lVar31 = 0;
                    do {
                      lVar22 = *(long *)(local_78 + lVar25 * 8 + lVar31 * 8);
                      if (trans == 0) {
                        if (local_168 <= local_178) {
                          pdVar34 = (double *)((long)pvVar14 + lVar22 * 0x10 + lVar40 * -0x10 + 8);
                          lVar22 = lVar43;
                          pauVar28 = local_1e0;
                          do {
                            pdVar39 = (double *)(local_90 + (lVar31 + lVar25) * 0x10);
                            dVar3 = *pdVar39;
                            dVar4 = pdVar39[1];
                            auVar47._0_8_ =
                                 *(double *)*pauVar28 + pdVar34[-1] * dVar3 + -dVar4 * *pdVar34;
                            auVar47._8_8_ =
                                 *(double *)(*pauVar28 + 8) + pdVar34[-1] * dVar4 + dVar3 * *pdVar34
                            ;
                            *pauVar28 = auVar47;
                            pauVar28 = pauVar28 + local_148;
                            pdVar34 = pdVar34 + lVar43 * 2;
                            lVar22 = lVar22 + -1;
                          } while (lVar22 != 0);
                        }
                      }
                      else if (local_168 <= local_178) {
                        lVar35 = (lVar22 - lVar40) * lVar43 * 0x10;
                        lVar20 = 0;
                        lVar22 = lVar43;
                        do {
                          pdVar34 = (double *)(local_90 + (lVar31 + lVar25) * 0x10);
                          dVar9 = *pdVar34;
                          dVar10 = pdVar34[1];
                          dVar3 = *(double *)((long)pvVar14 + lVar20 + lVar35);
                          dVar4 = *(double *)((long)pvVar14 + lVar20 + lVar35 + 8);
                          auVar46._0_8_ =
                               *(double *)(*local_180 + lVar20 + local_148 * local_158) +
                               dVar3 * dVar9 + -dVar10 * dVar4;
                          auVar46._8_8_ =
                               *(double *)((long)(*local_180 + lVar20 + local_148 * local_158) + 8)
                               + dVar3 * dVar10 + dVar9 * dVar4;
                          *(undefined1 (*) [16])(*local_180 + lVar20 + local_148 * local_158) =
                               auVar46;
                          lVar20 = lVar20 + 0x10;
                          lVar22 = lVar22 + -1;
                        } while (lVar22 != 0);
                      }
                      lVar31 = lVar31 + 1;
                    } while (lVar31 != lVar50 - lVar25);
                  }
                  local_158 = local_158 + 0x10;
                  local_1e0 = local_1e0 + 1;
                  lVar25 = local_150 + 1;
                } while (local_150 + 1 != lVar1);
              }
              break;
            case 0xf:
              if (lVar17 <= lVar1) {
                lVar43 = (local_178 - local_168) + 1;
                local_1b0 = 0;
                lVar25 = lVar26;
                do {
                  lVar50 = *(long *)(local_70 + (lVar25 - lVar26) * 8);
                  lVar31 = *(long *)(local_70 + 8 + (lVar25 - lVar26) * 8);
                  if (lVar50 < lVar31) {
                    lVar22 = local_90 + lVar50 * 8;
                    lVar20 = 0;
                    do {
                      lVar35 = *(long *)(local_78 + lVar50 * 8 + lVar20 * 8) - lVar40;
                      if (trans == 0) {
                        if (local_168 <= local_178) {
                          plVar32 = (long *)((long)pvVar14 + lVar35 * 8);
                          plVar24 = (long *)(*local_180 + local_1b0);
                          lVar35 = lVar43;
                          do {
                            *plVar24 = *plVar24 + *plVar32 * *(long *)(lVar22 + lVar20 * 8);
                            plVar24 = plVar24 + local_148;
                            plVar32 = plVar32 + lVar43;
                            lVar35 = lVar35 + -1;
                          } while (lVar35 != 0);
                        }
                      }
                      else if (local_168 <= local_178) {
                        lVar23 = 0;
                        do {
                          *(long *)(*local_180 + lVar23 * 8 + local_148 * local_1b0) =
                               *(long *)(*local_180 + lVar23 * 8 + local_148 * local_1b0) +
                               *(long *)((long)pvVar14 + lVar23 * 8 + lVar35 * lVar43 * 8) *
                               *(long *)(lVar22 + lVar20 * 8);
                          lVar23 = lVar23 + 1;
                        } while (lVar43 != lVar23);
                      }
                      lVar20 = lVar20 + 1;
                    } while (lVar20 != lVar31 - lVar50);
                  }
                  lVar25 = lVar25 + 1;
                  local_1b0 = local_1b0 + 8;
                } while (lVar25 != lVar1);
              }
            }
          }
          free(pvVar14);
          lVar40 = local_98 + 1;
          lVar25 = local_b0;
          g_a = local_b8;
        } while (lVar40 < *(long *)((long)&SPA->nblocks + local_b0));
      }
      IVar12 = local_c0 + 1;
    } while (IVar12 != local_130);
  }
  if ((int)local_128 != 0) {
    pnga_pgroup_sync(*(Integer *)((long)&SPA->grp + lVar25));
  }
  return g_a;
}

Assistant:

Integer pnga_sprs_array_sprsdns_multiply(Integer s_a, Integer g_b, Integer trans)
{
  Integer lcnt;
  Integer icnt;
  Integer hdl_a = s_a+GA_OFFSET;
  Integer hdl_b = g_b+GA_OFFSET;
  Integer hdl_c;
  int local_sync_begin,local_sync_end;
  Integer elemsize;
  Integer idim, jdim;
  Integer i, j, k, l, m, n, nn;
  Integer nprocs = pnga_pgroup_nnodes(SPA[hdl_a].grp);
  Integer me = pnga_pgroup_nodeid(SPA[hdl_a].grp);
  Integer longidx;
  Integer type;
  Integer jhi, jlo;
  Integer gdims[2], blocks[2];
  Integer rowdim;
  Integer *count;
  Integer nblocks;
  Integer g_c;
  Integer two = 2;
  Integer ilen;
  Integer max_nnz_a, max_nnz_b;
  Integer *row_nnz;
  int64_t max_nnz;
  Integer *map, *size;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[hdl_a].grp);

  /* Do some initial verification to see if matrix multiply is possible */
  if (SPA[hdl_a].type != GA[hdl_b].type) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) types of sparse matrices"
    " A and B must match",0);
  }
  type = SPA[hdl_a].type;
  if (SPA[hdl_a].grp != GA[hdl_b].p_handle) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) matrices A and B must"
    " be on the same group",0);
  }
  if (GA[hdl_b].ndim != 2) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) matrix B must be"
    " of dimension 2",GA[hdl_b].ndim);
  }
  if ((trans && SPA[hdl_a].jdim != GA[hdl_b].dims[1]) ||
      (!trans && SPA[hdl_a].jdim != GA[hdl_b].dims[0])) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) column dimension of"
      " A must match row dimension of B",0);
  }
  if (SPA[hdl_a].idx_size == sizeof(int64_t)) {
    longidx = 1;
  } else {
    longidx = 0;
  }
  elemsize = SPA[hdl_a].size;
  idim = SPA[hdl_a].idim;
  if (trans) {
    jdim = GA[hdl_b].dims[0];
  } else {
    jdim = GA[hdl_b].dims[1];
  }
  /* Construct product array C*/
  pnga_mask_sync(local_sync_begin,local_sync_end);
  g_c = pnga_create_handle();
  hdl_c = g_c + GA_OFFSET;
  if (trans) {
    gdims[0] = jdim;
    gdims[1] = idim;
  } else {
    gdims[0] = idim;
    gdims[1] = jdim;
  }
  pnga_set_data(g_c,two,gdims,type);
  map = (Integer*)malloc((nprocs+1)*sizeof(Integer));
  size = (Integer*)malloc(nprocs*sizeof(Integer));
  for (i=0; i<nprocs; i++) size[i] = 0;
  size[me] = SPA[hdl_a].ihi-SPA[hdl_a].ilo+1;
  if (sizeof(Integer) == 8) {
    pnga_pgroup_gop(SPA[hdl_a].grp,C_LONG,size,nprocs,"+");
  } else {
    pnga_pgroup_gop(SPA[hdl_a].grp,C_INT,size,nprocs,"+");
  }
  if (trans) {
    map[0] = 1;
    map[1] = 1;
    for (i=1; i<nprocs; i++) {
      map[i+1] = map[i] + size[i-1];
    }
    blocks[0] = 1;
    blocks[1] = nprocs;
  } else {
    map[0] = 1;
    for (i=1; i<nprocs; i++) {
      map[i] = map[i-1] + size[i-1];
    }
    map[nprocs] = 1;
    blocks[0] = nprocs;
    blocks[1] = 1;
  }
  pnga_set_irreg_distr(g_c,map,blocks);
  pnga_set_pgroup(g_c,SPA[hdl_a].grp);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_allocate(g_c)) {
    pnga_error("(ga_sprs_array_sprsdns_multiply) could not allocate"
      " product array C",0);
  }
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_zero(g_c);
  /* loop over processors in row to get target block and then loop over
   * processors to get all block pairs that contribute to target block.
   * Multiply block pairs */
  for (l=0; l<nprocs; l++) {
    /* Find bounding dimensions (unit-based) of target block in row */
    void *data_c;
    void *data_a, *data_b;
    Integer lo_c[2], hi_c[2], ld_c[2];
    Integer tlo_c[2], thi_c[2];
    lo_c[0] = SPA[hdl_a].ilo+1;
    hi_c[0] = SPA[hdl_a].ihi+1;
    pnga_sprs_array_column_distribution(s_a,l,&lo_c[1],&hi_c[1]);
    lo_c[1]++;
    hi_c[1]++;
    /* loop over all sub-blocks in column and row block that contribute
     * to target block */
    if (trans) {
      tlo_c[0] = lo_c[1];
      thi_c[0] = hi_c[1];
      tlo_c[1] = lo_c[0];
      thi_c[1] = hi_c[0];
    } else {
      tlo_c[0] = lo_c[0];
      thi_c[0] = hi_c[0];
      tlo_c[1] = lo_c[1];
      thi_c[1] = hi_c[1];
    }
    /* loop over non-zero blocks in row in sparse matrix A */
    for (nn=0; nn<SPA[hdl_a].nblocks; nn++) {
      void *iptr_a, *jptr_a;
      Integer ilo_a, ihi_a, jlo_a, jhi_a;
      Integer lo_b[2], hi_b[2], ld_b[2];
      Integer tlo_b[2], thi_b[2];
      void *val_a;
      void *buf_b;
      Integer nelem;
      Integer ii,jlen;
      n = SPA[hdl_a].blkidx[nn];
      /* calculate values of jlo and jhi for block in g_b */
      if (trans) {
        ld_c[0] = jdim;
        ld_c[1] = thi_c[1]-tlo_c[1]+1;
      } else {
        ld_c[0] = thi_c[0]-tlo_c[0]+1;
        ld_c[1] = jdim;
      }
      pnga_access_ptr(g_c,tlo_c,thi_c,&data_c,ld_c);
      /* Find block of A for multiplication */
      ilo_a = lo_c[0]-1;
      ihi_a = hi_c[0]-1;
      pnga_sprs_array_column_distribution(s_a, n, &jlo_a, &jhi_a);
      /* get pointer to sparse block */
      pnga_sprs_array_access_col_block(s_a, n, &iptr_a, &jptr_a, &val_a);
      lo_b[0] = jlo_a+1;
      hi_b[0] = jhi_a+1;
      lo_b[1] = lo_c[1];
      hi_b[1] = hi_c[1];
      if (trans) {
        tlo_b[0] = lo_b[1];
        thi_b[0] = hi_b[1];
        tlo_b[1] = lo_b[0];
        thi_b[1] = hi_b[0];
      } else {
        tlo_b[0] = lo_b[0];
        thi_b[0] = hi_b[0];
        tlo_b[1] = lo_b[1];
        thi_b[1] = hi_b[1];
      }
      /* Copy block from dense array into buffer */
      nelem = (thi_b[0]-tlo_b[0]+1)*(thi_b[1]-tlo_b[1]+1);
      buf_b = malloc(nelem*SPA[hdl_a].size);
      ld_b[0] = (thi_b[0]-tlo_b[0]+1);
      ld_b[1] = (thi_b[1]-tlo_b[1]+1);
      pnga_get(g_b,tlo_b,thi_b,buf_b,ld_b);
      if (SPA[hdl_a].idx_size == 4) {
        int *idx_a = (int*)iptr_a;
        int *jdx_a = (int*)jptr_a;
        data_a = val_a;
        /* now have access to blocks from A, B, and C. Perform block
         * multiplication */
        if (type == C_INT) {
          REAL_SPRSDNS_MULTIPLY_M(int,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_LONG) {
          REAL_SPRSDNS_MULTIPLY_M(long,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_LONGLONG) {
          REAL_SPRSDNS_MULTIPLY_M(long long,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_FLOAT) {
          REAL_SPRSDNS_MULTIPLY_M(float,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_DBL) {
          REAL_SPRSDNS_MULTIPLY_M(double,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_SCPL) {
          COMPLEX_SPRSDNS_MULTIPLY_M(float,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_DCPL) {
          COMPLEX_SPRSDNS_MULTIPLY_M(double,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        }
      } else {
        int64_t *idx_a = (int64_t*)iptr_a;
        int64_t *jdx_a = (int64_t*)jptr_a;
        data_a = val_a;
        /* now have access to blocks from A, B, and C. Perform block
         * multiplication */
        if (type == C_INT) {
          REAL_SPRSDNS_MULTIPLY_M(int,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_LONG) {
          REAL_SPRSDNS_MULTIPLY_M(long,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_LONGLONG) {
          REAL_SPRSDNS_MULTIPLY_M(long long,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_FLOAT) {
          REAL_SPRSDNS_MULTIPLY_M(float,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],thi_b[0],
              idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_DBL) {
          REAL_SPRSDNS_MULTIPLY_M(double,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_SCPL) {
          COMPLEX_SPRSDNS_MULTIPLY_M(float,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        } else if (type == C_DCPL) {
          COMPLEX_SPRSDNS_MULTIPLY_M(double,ilo_a,ihi_a,jlo_a,jhi_a,tlo_b[0],
              thi_b[0],idx_a,jdx_a,data_a,buf_b,data_c,ld_c[0]);
        }
      }
      free(buf_b);
    }
  }
  if (local_sync_end) pnga_pgroup_sync(SPA[hdl_a].grp);
  return g_c;
}